

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveAlign::CDirectiveAlign(CDirectiveAlign *this,ArgumentList *args)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Entry *pEVar4;
  int num;
  ArgumentList *args_local;
  CDirectiveAlign *this_local;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveAlign_001f2c50;
  CExpressionCommandList::CExpressionCommandList(&this->fillExpression);
  sVar3 = ArgumentList::size(args);
  if (sVar3 == 0) {
    iVar2 = (*Arch->_vptr_CArchitecture[5])();
    this->alignment = iVar2;
  }
  else {
    pEVar4 = ArgumentList::operator[](args,0);
    bVar1 = ConvertExpression(&pEVar4->text,&this->alignment);
    if (!bVar1) {
      pEVar4 = ArgumentList::operator[](args,0);
      Logger::printError<std::__cxx11::wstring>(FatalError,L"Invalid alignment %s",&pEVar4->text);
    }
    bVar1 = isPowerOfTwo(this->alignment);
    if (!bVar1) {
      Logger::printError<int>(Error,L"Invalid alignment %d",&this->alignment);
    }
  }
  computePadding(this);
  return;
}

Assistant:

CDirectiveAlign::CDirectiveAlign(ArgumentList& args)
{
	if (args.size() >= 1)
	{
		if (ConvertExpression(args[0].text,alignment) == false)
		{
			Logger::printError(Logger::FatalError,L"Invalid alignment %s",args[0].text);
		}
		if (isPowerOfTwo(alignment) == false)
		{
			Logger::printError(Logger::Error,L"Invalid alignment %d",alignment);
		}
	} else {
		alignment = Arch->GetWordSize();
	}

	int num = computePadding();
}